

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

GeneratedCodeInfo *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::GeneratedCodeInfo>(Arena *arena)

{
  GeneratedCodeInfo *this;
  
  if (arena == (Arena *)0x0) {
    this = (GeneratedCodeInfo *)operator_new(0x30);
    GeneratedCodeInfo::GeneratedCodeInfo(this,(Arena *)0x0);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&GeneratedCodeInfo::typeinfo,0x30);
    }
    this = (GeneratedCodeInfo *)AllocateAlignedNoHook(arena,0x30);
    GeneratedCodeInfo::GeneratedCodeInfo(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::GeneratedCodeInfo* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::GeneratedCodeInfo >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::GeneratedCodeInfo >(arena);
}